

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::bt_peer_connection::write_hashes
          (bt_peer_connection *this,hash_request *req,span<libtorrent::digest32<256L>_> hashes)

{
  _Atomic_word *p_Var1;
  file_index_t index;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  _func_int *p_Var6;
  element_type *this_00;
  counters *this_01;
  uint val;
  char *pcVar7;
  char *pcVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  digest32<256L> *pdVar12;
  ulong uVar13;
  uint uVar14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  char *pcVar15;
  element_type *peVar16;
  digest32<256L> *__begin2;
  char *pcVar17;
  digest32<256L> *pdVar18;
  bool bVar19;
  span<const_char> buf;
  undefined1 auStack_78 [8];
  sha256_hash root;
  ulong local_38;
  
  lVar11 = hashes.m_len;
  pdVar12 = hashes.m_ptr;
  pcVar15 = auStack_78;
  iVar10 = (int)hashes.m_len * 0x20;
  uVar14 = iVar10 + 0x35;
  local_38 = (ulong)(int)uVar14;
  root.m_number._M_elems._24_8_ = lVar11;
  if ((long)local_38 < 0x1001) {
    if ((int)uVar14 < 1) {
      local_38 = 0;
      pcVar7 = (char *)0x0;
    }
    else {
      pcVar15 = (char *)((long)&root + (-8 - (ulong)((uVar14 & 0x7ffffff5) + 0xf & 0xfffffff0)));
      pcVar7 = pcVar15;
    }
  }
  else {
    pcVar7 = (char *)operator_new__(local_38);
    pcVar15 = auStack_78;
  }
  iVar9 = 0x18;
  pcVar8 = pcVar7;
  do {
    pcVar17 = pcVar8;
    *pcVar17 = (char)(iVar10 + 0x31U >> ((byte)iVar9 & 0x1f));
    iVar9 = iVar9 + -8;
    pcVar8 = pcVar17 + 1;
  } while (iVar9 != -8);
  pcVar17[1] = '\x16';
  peVar16 = (this->super_peer_connection).super_peer_connection_hot_members.m_torrent.
            super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var5 = (this->super_peer_connection).super_peer_connection_hot_members.m_torrent.
           super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  this_02 = p_Var5;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var5->_M_weak_count = p_Var5->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      p_Var5->_M_weak_count = p_Var5->_M_weak_count + 1;
    }
    if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      iVar10 = p_Var5->_M_use_count;
      do {
        this_02 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (iVar10 == 0) break;
        LOCK();
        iVar9 = p_Var5->_M_use_count;
        bVar19 = iVar10 == iVar9;
        if (bVar19) {
          p_Var5->_M_use_count = iVar10 + 1;
          iVar9 = iVar10;
        }
        iVar10 = iVar9;
        UNLOCK();
        this_02 = p_Var5;
      } while (!bVar19);
    }
  }
  if (this_02 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    peVar16 = (element_type *)0x0;
  }
  else if (this_02->_M_use_count == 0) {
    peVar16 = (element_type *)0x0;
  }
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var5->_M_weak_count;
      iVar10 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar10 = p_Var5->_M_weak_count;
      p_Var5->_M_weak_count = iVar10 + -1;
    }
    if (iVar10 == 1) {
      p_Var6 = p_Var5->_vptr__Sp_counted_base[3];
      pcVar15[-8] = '\x05';
      pcVar15[-7] = -0x35;
      pcVar15[-6] = '\x18';
      pcVar15[-5] = '\0';
      pcVar15[-4] = '\0';
      pcVar15[-3] = '\0';
      pcVar15[-2] = '\0';
      pcVar15[-1] = '\0';
      (*p_Var6)();
    }
  }
  if (peVar16 != (element_type *)0x0) {
    this_00 = (peVar16->super_torrent_hot_members).m_torrent_file.
              super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    index.m_val = (req->file).m_val;
    pcVar15[-8] = '&';
    pcVar15[-7] = -0x35;
    pcVar15[-6] = '\x18';
    pcVar15[-5] = '\0';
    pcVar15[-4] = '\0';
    pcVar15[-3] = '\0';
    pcVar15[-2] = '\0';
    pcVar15[-1] = '\0';
    file_storage::root((sha256_hash *)auStack_78,&this_00->m_files,index);
    *(undefined8 *)(pcVar17 + 0x12) = root.m_number._M_elems._8_8_;
    *(undefined8 *)(pcVar17 + 0x1a) = root.m_number._M_elems._16_8_;
    *(undefined1 (*) [8])(pcVar17 + 2) = auStack_78;
    *(undefined8 *)(pcVar17 + 10) = root.m_number._M_elems._0_8_;
    pcVar8 = pcVar7 + 0x25;
    uVar14 = req->base;
    iVar10 = 0x18;
    do {
      *pcVar8 = (char)(uVar14 >> ((byte)iVar10 & 0x1f));
      pcVar8 = pcVar8 + 1;
      iVar10 = iVar10 + -8;
    } while (iVar10 != -8);
    uVar14 = req->index;
    iVar10 = 0x18;
    do {
      *pcVar8 = (char)(uVar14 >> ((byte)iVar10 & 0x1f));
      pcVar8 = pcVar8 + 1;
      iVar10 = iVar10 + -8;
    } while (iVar10 != -8);
    uVar14 = req->count;
    iVar10 = 0x18;
    do {
      *pcVar8 = (char)(uVar14 >> ((byte)iVar10 & 0x1f));
      pcVar8 = pcVar8 + 1;
      iVar10 = iVar10 + -8;
    } while (iVar10 != -8);
    uVar14 = req->proof_layers;
    iVar10 = 0x18;
    do {
      *pcVar8 = (char)(uVar14 >> ((byte)iVar10 & 0x1f));
      pcVar8 = pcVar8 + 1;
      iVar10 = iVar10 + -8;
    } while (iVar10 != -8);
    if (root.m_number._M_elems._24_8_ != 0) {
      pdVar18 = pdVar12 + lVar11;
      do {
        uVar13 = 0x21;
        lVar11 = 0;
        do {
          pcVar8[lVar11] = *(char *)((long)(pdVar12->m_number)._M_elems + lVar11);
          uVar13 = uVar13 - 1;
          lVar11 = lVar11 + 1;
        } while (1 < uVar13);
        pdVar12 = pdVar12 + 1;
        pcVar8 = pcVar8 + lVar11;
      } while (pdVar12 != pdVar18);
    }
    this_01 = (this->super_peer_connection).m_counters;
    pcVar15[-8] = -9;
    pcVar15[-7] = -0x35;
    pcVar15[-6] = '\x18';
    pcVar15[-5] = '\0';
    pcVar15[-4] = '\0';
    pcVar15[-3] = '\0';
    pcVar15[-2] = '\0';
    pcVar15[-1] = '\0';
    counters::inc_stats_counter(this_01,0x69,1);
    pcVar15[-8] = '\x04';
    pcVar15[-7] = -0x34;
    pcVar15[-6] = '\x18';
    pcVar15[-5] = '\0';
    pcVar15[-4] = '\0';
    pcVar15[-3] = '\0';
    pcVar15[-2] = '\0';
    pcVar15[-1] = '\0';
    bVar19 = peer_connection::should_log(&this->super_peer_connection,outgoing_message);
    if (bVar19) {
      uVar14 = (req->file).m_val;
      uVar2 = req->base;
      uVar3 = req->index;
      uVar4 = req->count;
      *(ulong *)(pcVar15 + -0x10) = (ulong)(uint)req->proof_layers;
      *(ulong *)(pcVar15 + -0x18) = (ulong)uVar4;
      *(ulong *)(pcVar15 + -0x20) = (ulong)uVar3;
      pcVar15[-0x28] = 'G';
      pcVar15[-0x27] = -0x34;
      pcVar15[-0x26] = '\x18';
      pcVar15[-0x25] = '\0';
      pcVar15[-0x24] = '\0';
      pcVar15[-0x23] = '\0';
      pcVar15[-0x22] = '\0';
      pcVar15[-0x21] = '\0';
      peer_connection::peer_log
                (&this->super_peer_connection,outgoing_message,"HASHES",
                 "file: %d base: %d idx: %d cnt: %d proofs: %d",(ulong)uVar14,(ulong)uVar2);
    }
    pcVar15[-8] = '[';
    pcVar15[-7] = -0x34;
    pcVar15[-6] = '\x18';
    pcVar15[-5] = '\0';
    pcVar15[-4] = '\0';
    pcVar15[-3] = '\0';
    pcVar15[-2] = '\0';
    pcVar15[-1] = '\0';
    buf.m_len = local_38;
    buf.m_ptr = pcVar7;
    peer_connection::send_buffer(&this->super_peer_connection,buf);
  }
  if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    pcVar15[-8] = 'h';
    pcVar15[-7] = -0x34;
    pcVar15[-6] = '\x18';
    pcVar15[-5] = '\0';
    pcVar15[-4] = '\0';
    pcVar15[-3] = '\0';
    pcVar15[-2] = '\0';
    pcVar15[-1] = '\0';
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
  }
  if (pcVar7 != (char *)0x0 && 0x1000 < (long)local_38) {
    pcVar15[-8] = -0x7a;
    pcVar15[-7] = -0x34;
    pcVar15[-6] = '\x18';
    pcVar15[-5] = '\0';
    pcVar15[-4] = '\0';
    pcVar15[-3] = '\0';
    pcVar15[-2] = '\0';
    pcVar15[-1] = '\0';
    operator_delete__(pcVar7);
  }
  return;
}

Assistant:

void bt_peer_connection::write_hashes(hash_request const& req, span<sha256_hash> hashes)
	{
		INVARIANT_CHECK;

		int const packet_size = int(5 + sha256_hash::size()
			+ 4 * 4
			+ sha256_hash::size() * hashes.size());
		TORRENT_ALLOCA(buf, char, packet_size);
		char* ptr = buf.data();
		aux::write_uint32(packet_size - 4, ptr);
		aux::write_uint8(msg_hashes, ptr);

		auto t = associated_torrent().lock();
		if (!t) return;
		auto const& ti = t->torrent_file();
		auto const& fs = ti.files();
		auto root = fs.root(req.file);

		ptr = std::copy(root.begin(), root.end(), ptr);

		aux::write_uint32(req.base, ptr);
		aux::write_uint32(req.index, ptr);
		aux::write_uint32(req.count, ptr);
		aux::write_uint32(req.proof_layers, ptr);

		for (auto const& h : hashes)
			ptr = std::copy(h.begin(), h.end(), ptr);

		stats_counters().inc_stats_counter(counters::num_outgoing_hashes);

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log(peer_log_alert::outgoing_message))
		{
			peer_log(peer_log_alert::outgoing_message, "HASHES"
				, "file: %d base: %d idx: %d cnt: %d proofs: %d"
				, static_cast<int>(req.file), req.base, req.index, req.count, req.proof_layers);
		}
#endif

		send_buffer(buf);
	}